

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O2

uint8_t * dtl_json_reader_parse_block(dtl_json_reader_t *self,uint8_t *pBegin,uint8_t *pEnd)

{
  bstr_context_t *ctx;
  byte bVar1;
  dtl_json_readerData_t *pdVar2;
  byte bVar3;
  int iVar4;
  int32_t iVar5;
  uint32_t uVar6;
  adt_str_t *str;
  byte *pbVar7;
  dtl_sv_t *pdVar8;
  byte *pbVar9;
  char *pKey;
  dtl_json_readerData_t *pdVar10;
  dtl_av_t *pdVar11;
  dtl_hv_t *pdVar12;
  _Bool bl;
  uint uVar13;
  bstr_number_t local_40;
  
  bVar3 = self->parseState;
  if (bVar3 == 0) {
    self->parseState = '\x02';
    bVar3 = 2;
  }
  ctx = &self->ctx;
  do {
    if ((bVar3 < 2) || (pEnd <= pBegin)) {
      if (bVar3 == 1) {
        dtl_av_delete((dtl_av_t *)self->data->currentElem);
      }
      return pBegin;
    }
    if (8 < bVar3 - 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                    ,0x1e8,
                    "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                   );
    }
    bVar1 = *pBegin;
    uVar13 = (uint)bVar1;
    switch((uint)bVar3) {
    case 2:
      pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
      self->parseState = '\x03';
      break;
    case 3:
      iVar4 = bstr_pred_is_digit(uVar13);
      pbVar9 = pBegin;
      if ((uVar13 == 0x2d) || (iVar4 != 0)) {
        pbVar7 = bstr_parse_json_number(ctx,pBegin,pEnd,&local_40);
        if (pBegin < pbVar7) {
          if (((local_40.hasInteger == true) && (local_40.hasFraction == false)) &&
             (local_40.hasExponent == false)) {
            if (local_40.isNegative == true) {
              if ((int)local_40.integer < 0) {
                pdVar8 = dtl_sv_make_i64(-(ulong)local_40.integer);
              }
              else {
                uVar13 = -local_40.integer;
LAB_00139f29:
                pdVar8 = dtl_sv_make_i32(uVar13);
              }
            }
            else {
              uVar13 = local_40.integer;
              if (-1 < (int)local_40.integer) goto LAB_00139f29;
              pdVar8 = dtl_sv_make_u32(local_40.integer);
            }
            self->data->currentElem = (dtl_dv_t *)pdVar8;
            self->parseState = '\x04';
            pbVar9 = pbVar7;
          }
          else {
            self->parseState = '\x01';
          }
        }
      }
      else if (uVar13 == 0x7b) {
        pdVar12 = dtl_hv_new();
        self->data->currentElem = (dtl_dv_t *)pdVar12;
        if (pdVar12 != (dtl_hv_t *)0x0) {
          self->parseState = '\a';
          goto LAB_00139ed8;
        }
LAB_00139ede:
        self->parseState = '\x01';
        self->lastError = 1;
      }
      else if (uVar13 == 0x5b) {
        pdVar11 = dtl_av_new();
        self->data->currentElem = (dtl_dv_t *)pdVar11;
        if (pdVar11 == (dtl_av_t *)0x0) goto LAB_00139ede;
        self->parseState = '\x05';
LAB_00139ed8:
        pbVar9 = pBegin + 1;
      }
      else if (uVar13 == 0x66) {
        pbVar7 = bstr_match_cstr(pBegin,pEnd,"false");
        if (pBegin < pbVar7) {
          bl = false;
LAB_00139e54:
          pdVar8 = dtl_sv_make_bool(bl);
          self->data->currentElem = (dtl_dv_t *)pdVar8;
          self->parseState = '\x04';
          pbVar9 = pbVar7;
        }
      }
      else if (uVar13 == 0x6e) {
        pbVar7 = bstr_match_cstr(pBegin,pEnd,"null");
        if (pBegin < pbVar7) {
          self->data->currentElem = (dtl_dv_t *)&g_dtl_sv_none;
          self->parseState = '\x04';
          pbVar9 = pbVar7;
        }
      }
      else if (uVar13 == 0x74) {
        pbVar7 = bstr_match_cstr(pBegin,pEnd,"true");
        if (pBegin < pbVar7) {
          bl = true;
          goto LAB_00139e54;
        }
      }
      else if (uVar13 == 0x22) {
        str = adt_str_new();
        if (str != (adt_str_t *)0x0) {
          pbVar7 = bstr_parse_json_string_literal(ctx,pBegin,pEnd,str);
          if (pBegin < pbVar7) {
            pdVar8 = dtl_sv_make_str(str);
            self->data->currentElem = (dtl_dv_t *)pdVar8;
            self->parseState = '\x04';
            pbVar9 = pbVar7;
          }
          adt_str_delete(str);
        }
      }
      else {
        self->parseState = '\x01';
        self->lastError = 2;
      }
      if (pBegin < pbVar9) {
        pBegin = pbVar9;
      }
      break;
    case 4:
      pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
      pdVar10 = self->data;
      if (pdVar10->isArray == true) {
        if ((dtl_av_t *)pdVar10->parentElem == (dtl_av_t *)0x0) {
          __assert_fail("self->data->parentElem != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                        ,0x13b,
                        "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                       );
        }
        dtl_av_push((dtl_av_t *)pdVar10->parentElem,pdVar10->currentElem,false);
        self->data->currentElem = (dtl_dv_t *)0x0;
        self->parseState = '\x06';
      }
      else if (pdVar10->isObject == true) {
        pdVar12 = (dtl_hv_t *)pdVar10->parentElem;
        if (pdVar12 == (dtl_hv_t *)0x0) {
          __assert_fail("self->data->parentElem != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                        ,0x142,
                        "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                       );
        }
        pKey = adt_str_cstr(&pdVar10->objectKey);
        dtl_hv_set_cstr(pdVar12,pKey,self->data->currentElem,false);
        pdVar10 = self->data;
        pdVar10->currentElem = (dtl_dv_t *)0x0;
        adt_str_clear(&pdVar10->objectKey);
        self->parseState = '\n';
      }
      else {
        self->parseState = '\0';
      }
      break;
    case 5:
      pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
      if (pBegin < pEnd) {
        if (*pBegin == 0x5d) {
LAB_00139c0b:
          self->parseState = '\x04';
          pBegin = pBegin + 1;
        }
        else {
          pdVar10 = dtl_json_readerData_new();
          if (pdVar10 == (dtl_json_readerData_t *)0x0) {
LAB_00139de8:
            self->parseState = '\x01';
            self->lastError = 1;
          }
          else {
            pdVar10->isArray = true;
            pdVar2 = self->data;
            pdVar10->parentElem = pdVar2->currentElem;
            adt_stack_push(&self->stack,pdVar2);
            self->data = pdVar10;
            self->parseState = '\x02';
          }
        }
      }
      break;
    case 6:
      if (bVar1 == 0x5d) {
        dtl_dv_inc_ref(self->data->currentElem);
        dtl_json_readerData_delete(self->data);
        uVar6 = adt_stack_size(&self->stack);
        if (uVar6 == 0) {
          __assert_fail("adt_stack_size(&self->stack) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                        ,0x177,
                        "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                       );
        }
LAB_00139d81:
        pdVar10 = (dtl_json_readerData_t *)adt_stack_top(&self->stack);
        self->data = pdVar10;
        adt_stack_pop(&self->stack);
        self->parseState = '\x04';
        pBegin = pBegin + 1;
      }
      else {
        if (bVar1 == 0x2c) goto LAB_00139b31;
LAB_00139c99:
        self->parseState = '\x01';
        self->lastError = 2;
      }
      break;
    case 7:
      pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
      if (pBegin < pEnd) {
        if (*pBegin == 0x7d) goto LAB_00139c0b;
        pdVar10 = dtl_json_readerData_new();
        if (pdVar10 == (dtl_json_readerData_t *)0x0) goto LAB_00139de8;
        pdVar10->isObject = true;
        pdVar2 = self->data;
        pdVar10->parentElem = pdVar2->currentElem;
        adt_stack_push(&self->stack,pdVar2);
        self->data = pdVar10;
        self->parseState = '\b';
      }
      break;
    case 8:
      pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
      if (pBegin < pEnd) {
        if (*pBegin == 0x22) {
          pbVar9 = bstr_parse_json_string_literal(ctx,pBegin,pEnd,&self->data->objectKey);
          if (pBegin < pbVar9) {
            iVar5 = adt_str_length(&self->data->objectKey);
            pBegin = pbVar9;
            if (iVar5 == 0) {
              self->parseState = '\x01';
              self->lastError = 4;
            }
            else {
              self->parseState = '\t';
            }
          }
          else {
            self->parseState = '\x01';
            self->lastError = 5;
          }
        }
        else {
          self->parseState = '\x01';
          self->lastError = 2;
        }
      }
      break;
    case 9:
      pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
      if ((pBegin < pEnd) && (*pBegin == 0x3a)) {
LAB_00139b31:
        self->parseState = '\x02';
        pBegin = pBegin + 1;
      }
      break;
    case 10:
      if (uVar13 == 0x7d) {
        dtl_dv_inc_ref(self->data->currentElem);
        dtl_json_readerData_delete(self->data);
        uVar6 = adt_stack_size(&self->stack);
        if (uVar6 == 0) {
          __assert_fail("adt_stack_size(&self->stack) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                        ,0x1dc,
                        "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                       );
        }
        goto LAB_00139d81;
      }
      if (uVar13 != 0x2c) goto LAB_00139c99;
      self->parseState = '\b';
      pBegin = pBegin + 1;
    }
    bVar3 = self->parseState;
  } while( true );
}

Assistant:

static const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *self, const uint8_t *pBegin, const uint8_t *pEnd)
{
   const uint8_t *pNext = pBegin;

   if (self->parseState == PARSE_STATE_NONE)
   {
      self->parseState = PARSE_STATE_PRE_VALUE;
   }
   while( (self->parseState != PARSE_STATE_NONE) && (self->parseState != PARSE_STATE_ERROR) && (pNext < pEnd) )
   {
      const uint8_t *pResult;
      uint8_t nextChar = *pNext;

      switch(self->parseState)
      {
      case PARSE_STATE_PRE_VALUE:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         self->parseState = PARSE_STATE_VALUE;
         break;
      case PARSE_STATE_VALUE:
         pResult = dtl_json_reader_parse_value(self, pNext, pEnd);
         if (pResult > pNext)
         {
            pNext = pResult;
         }
         break;
      case PARSE_STATE_POST_VALUE:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if (self->data->isArray)
         {
            assert(self->data->parentElem != 0);
            dtl_av_push((dtl_av_t*) self->data->parentElem, self->data->currentElem, false);
            self->data->currentElem = (dtl_dv_t*) 0;
            self->parseState = PARSE_STATE_ARRAY_NEXT;
         }
         else if (self->data->isObject)
         {
            assert(self->data->parentElem != 0);
            dtl_hv_set_cstr((dtl_hv_t*) self->data->parentElem, adt_str_cstr(&self->data->objectKey), self->data->currentElem, false);
            self->data->currentElem = (dtl_dv_t*) 0;
            adt_str_clear(&self->data->objectKey);
            self->parseState = PARSE_STATE_OBJECT_NEXT;
         }
         else
         {
            self->parseState = PARSE_STATE_NONE;
         }
         break;
      case PARSE_STATE_ARRAY_BEGIN:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar==']')
            {
               //empty array, no need to create child state
               self->parseState = PARSE_STATE_POST_VALUE;
               pNext++;
            }
            else
            {
               //non-empty array, push current data and initiate child state
               dtl_json_readerData_t *childData = dtl_json_readerData_new();
               if (childData != 0)
               {
                  childData->isArray = true;
                  childData->parentElem = self->data->currentElem;
                  adt_stack_push(&self->stack, self->data);
                  self->data = childData;
                  self->parseState = PARSE_STATE_PRE_VALUE;
               }
               else
               {
                  self->parseState = PARSE_STATE_ERROR;
                  self->lastError = DTL_JSON_MEM_ERROR;
               }
            }
         }
         break;
      case PARSE_STATE_ARRAY_NEXT:
         if (nextChar == ',')
         {
            pNext++;
            self->parseState = PARSE_STATE_PRE_VALUE;
         }
         else if(nextChar == ']')
         {
            pNext++;
            dtl_dv_inc_ref(self->data->currentElem);
            dtl_json_readerData_delete(self->data);
            assert(adt_stack_size(&self->stack) > 0);
            self->data = adt_stack_top(&self->stack);
            adt_stack_pop(&self->stack);
            self->parseState = PARSE_STATE_POST_VALUE;
         }
         else
         {
            self->parseState = PARSE_STATE_ERROR;
            self->lastError = DTL_JSON_UNEXPECTED_CHAR_ERROR;
         }
         break;
      case PARSE_STATE_OBJECT_BEGIN:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar=='}')
            {
               //empty object, no need to create child state
               self->parseState = PARSE_STATE_POST_VALUE;
               pNext++;
            }
            else
            {
               //non-empty array, push current data and initiate child state
               dtl_json_readerData_t *childData = dtl_json_readerData_new();
               if (childData != 0)
               {
                  childData->isObject = true;
                  childData->parentElem = self->data->currentElem;
                  adt_stack_push(&self->stack, self->data);
                  self->data = childData;
                  self->parseState = PARSE_STATE_OBJECT_KEY;
               }
               else
               {
                  self->parseState = PARSE_STATE_ERROR;
                  self->lastError = DTL_JSON_MEM_ERROR;
               }
            }
         }
         break;
      case PARSE_STATE_OBJECT_KEY:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar=='"')
            {
               const uint8_t *pInnerResult;
               pInnerResult = bstr_parse_json_string_literal(&self->ctx, pNext, pEnd, &self->data->objectKey);
               if (pInnerResult > pNext)
               {
                  pNext = pInnerResult;
                  if (adt_str_length(&self->data->objectKey) == 0)
                  {
                     self->parseState = PARSE_STATE_ERROR;
                     self->lastError = DTL_JSON_EMPTY_KEY_ERROR;
                  }
                  else
                  {
                     self->parseState = PARSE_STATE_OBJECT_SEP;
                  }
               }
               else
               {
                  self->parseState = PARSE_STATE_ERROR;
                  self->lastError = DTL_JSON_UNMATCHED_STRING_LITERAL;
               }
            }
            //TODO: We should probably allow stray comma here to make it easier for the user
            else
            {
               self->parseState = PARSE_STATE_ERROR;
               self->lastError = DTL_JSON_UNEXPECTED_CHAR_ERROR;
            }
         }
         break;
      case PARSE_STATE_OBJECT_SEP:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar==':')
            {
               pNext++;
               self->parseState = PARSE_STATE_PRE_VALUE;
            }
         }
         break;
      case PARSE_STATE_OBJECT_NEXT:
         if (nextChar == ',')
         {
            pNext++;
            self->parseState = PARSE_STATE_OBJECT_KEY;
         }
         else if(nextChar == '}')
         {
            pNext++;
            dtl_dv_inc_ref(self->data->currentElem);
            dtl_json_readerData_delete(self->data);
            assert(adt_stack_size(&self->stack) > 0);
            self->data = adt_stack_top(&self->stack);
            adt_stack_pop(&self->stack);
            self->parseState = PARSE_STATE_POST_VALUE;
         }
         else
         {
            self->parseState = PARSE_STATE_ERROR;
            self->lastError = DTL_JSON_UNEXPECTED_CHAR_ERROR;
         }
         break;
      default:
         assert(0);
      }
   }
   if (self->parseState == PARSE_STATE_ERROR)
   {
      dtl_av_delete((dtl_av_t*) self->data->currentElem);
   }
   return pNext;
}